

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree.cxx
# Opt level: O2

int __thiscall
Fl_Tree::extend_selection_dir
          (Fl_Tree *this,Fl_Tree_Item *from,Fl_Tree_Item *to,int dir,int val,bool visible)

{
  int iVar1;
  undefined4 in_register_0000000c;
  fd_set *__writefds;
  int iVar2;
  int iVar3;
  undefined4 in_register_00000084;
  undefined1 uVar4;
  undefined7 in_register_00000089;
  Fl_Tree_Item *item;
  
  __writefds = (fd_set *)CONCAT44(in_register_0000000c,dir);
  iVar2 = 0;
  iVar3 = val;
  uVar4 = visible;
  do {
    if (from == (Fl_Tree_Item *)0x0) {
      return iVar2;
    }
    if (val == 2) {
      select_toggle(this,from,(uint)(this->super_Fl_Group).super_Fl_Widget.when_);
      iVar2 = iVar2 + 1;
    }
    else {
      if (val == 1) {
        iVar1 = select(this,(int)from,(fd_set *)(ulong)(this->super_Fl_Group).super_Fl_Widget.when_,
                       __writefds,(fd_set *)CONCAT44(in_register_00000084,iVar3),
                       (timeval *)CONCAT71(in_register_00000089,uVar4));
      }
      else {
        if (val != 0) goto LAB_001d35b3;
        iVar1 = deselect(this,from,(uint)(this->super_Fl_Group).super_Fl_Widget.when_);
      }
      iVar2 = iVar2 + iVar1;
    }
LAB_001d35b3:
    if (from == to) {
      return iVar2;
    }
    __writefds = (fd_set *)(ulong)visible;
    from = next_item(this,from,dir,visible);
  } while( true );
}

Assistant:

int Fl_Tree::extend_selection_dir(Fl_Tree_Item *from, Fl_Tree_Item *to,
			          int dir, int val, bool visible ) {
  int changed = 0;
  for (Fl_Tree_Item *item=from; item; item = next_item(item, dir, visible) ) {
    switch (val) {
      case 0:
	if ( deselect(item, when()) ) ++changed;
        break;
      case 1:
        if ( select(item, when()) ) ++changed;
	break;
      case 2:
        select_toggle(item, when());
	++changed;	// toggle always involves a change
	break;
    }
    if ( item==to ) break;
  }
  return(changed);
}